

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O3

BOOL __thiscall FuncInfo::IsClassConstructor(FuncInfo *this)

{
  ParseableFunctionInfo *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  FunctionInfo *pFVar5;
  
  pPVar1 = this->byteCodeFunction;
  pFVar5 = (pPVar1->super_FunctionProxy).functionInfo.ptr;
  if (pFVar5 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x568,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0089e665;
    *puVar4 = 0;
    pFVar5 = (pPVar1->super_FunctionProxy).functionInfo.ptr;
  }
  if ((ParseableFunctionInfo *)(pFVar5->functionBodyImpl).ptr != pPVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x569,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                       "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) {
LAB_0089e665:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pFVar5 = (pPVar1->super_FunctionProxy).functionInfo.ptr;
  }
  return pFVar5->attributes >> 10 & 1;
}

Assistant:

BOOL FuncInfo::IsClassConstructor() const
{
    return this->byteCodeFunction->IsClassConstructor();
}